

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

void __thiscall
tld::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
vector(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       *this,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *that)

{
  ulong *puVar1;
  ulong *puVar2;
  size_t i;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  
  this->DEFAULT_CAPACITY = 0x10;
  uVar4 = that->capacity_;
  uVar3 = uVar4 << 5;
  puVar1 = (ulong *)operator_new__(-(ulong)(uVar4 >> 0x3b != 0) | uVar3 | 8);
  *puVar1 = uVar4;
  if (uVar4 != 0) {
    puVar2 = puVar1 + 3;
    do {
      puVar2[-2] = (ulong)puVar2;
      puVar2[-1] = 0;
      *(undefined1 *)puVar2 = 0;
      puVar2 = puVar2 + 4;
      uVar3 = uVar3 - 0x20;
    } while (uVar3 != 0);
  }
  this->m_data_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(puVar1 + 1);
  uVar3 = that->size_;
  this->size_ = uVar3;
  this->capacity_ = uVar4;
  lVar5 = 0;
  for (uVar4 = 0; uVar4 < uVar3; uVar4 = uVar4 + 1) {
    std::__cxx11::string::_M_assign((string *)((long)&(this->m_data_->_M_dataplus)._M_p + lVar5));
    uVar3 = this->size_;
    lVar5 = lVar5 + 0x20;
  }
  return;
}

Assistant:

vector<T>::vector(const vector<T>& that) :
    m_data_(new T[that.capacity_]),
    size_(that.size_),
    capacity_(that.capacity_)
{
    for (std::size_t i = 0; i < size_; i++)
        m_data_[i] = that.m_data_[i];
}